

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeSignedInteger
          (ParserImpl *this,int64 *value,uint64 max_value)

{
  byte bVar1;
  bool bVar2;
  long in_RDX;
  long *in_RSI;
  ParserImpl *in_RDI;
  uint64 *unaff_retaddr;
  ParserImpl *in_stack_00000008;
  uint64 unsigned_value;
  bool negative;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  long local_68;
  allocator local_49;
  string local_48 [39];
  byte local_21;
  long local_20;
  long *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_21 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"-",&local_49);
  bVar1 = TryConsume(in_RDI,(string *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((bVar1 & 1) != 0) {
    local_21 = 1;
    local_20 = local_20 + 1;
  }
  bVar2 = ConsumeUnsignedInteger
                    (in_stack_00000008,unaff_retaddr,
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar2) {
    if ((local_21 & 1) == 0) {
      *local_18 = local_68;
    }
    else if (local_68 == -0x8000000000000000) {
      *local_18 = -0x8000000000000000;
    }
    else {
      *local_18 = -local_68;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ConsumeSignedInteger(int64* value, uint64 max_value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
      // Two's complement always allows one more negative integer than
      // positive.
      ++max_value;
    }

    uint64 unsigned_value;

    DO(ConsumeUnsignedInteger(&unsigned_value, max_value));

    if (negative) {
      if ((static_cast<uint64>(kint64max) + 1) == unsigned_value) {
        *value = kint64min;
      } else {
        *value = -static_cast<int64>(unsigned_value);
      }
    } else {
      *value = static_cast<int64>(unsigned_value);
    }

    return true;
  }